

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall r_exec::View::delete_from_object(View *this)

{
  Code *pCVar1;
  size_type sVar2;
  View *local_18;
  View *local_10;
  View *this_local;
  
  local_10 = this;
  pCVar1 = core::P<r_code::Code>::operator->(&(this->super_View).object);
  (*(pCVar1->super__Object)._vptr__Object[0x11])();
  pCVar1 = core::P<r_code::Code>::operator->(&(this->super_View).object);
  local_18 = this;
  std::
  unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
  ::erase(&pCVar1->views,(key_type *)&local_18);
  pCVar1 = core::P<r_code::Code>::operator->(&(this->super_View).object);
  sVar2 = std::
          unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
          ::size(&pCVar1->views);
  if (sVar2 == 0) {
    pCVar1 = core::P<r_code::Code>::operator->(&(this->super_View).object);
    (*(pCVar1->super__Object)._vptr__Object[0x12])();
    pCVar1 = core::P<r_code::Code>::operator->(&(this->super_View).object);
    (*(pCVar1->super__Object)._vptr__Object[0xf])();
  }
  else {
    pCVar1 = core::P<r_code::Code>::operator->(&(this->super_View).object);
    (*(pCVar1->super__Object)._vptr__Object[0x12])();
  }
  return;
}

Assistant:

void View::delete_from_object()
{
    object->acq_views();
    object->views.erase(this);

    if (object->views.size() == 0) {
        object->rel_views(); // avoid deadlock
        object->invalidate();
    } else {
        object->rel_views();
    }
}